

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O0

void luaV_execute(lua_State *L,int nexeccalls)

{
  double dVar1;
  undefined8 uVar2;
  GCObject *pGVar3;
  lua_Alloc p_Var4;
  Value *pVVar5;
  StkId pTVar6;
  CallInfo *pCVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  GCObject *pGVar11;
  StkId pTVar12;
  TValue *pTVar13;
  TValue *pTVar14;
  GCObject *pGVar15;
  UpVal *pUVar16;
  uint uVar17;
  uint *pc_00;
  StkId pTVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  bool local_504;
  bool local_503;
  bool local_502;
  bool local_501;
  TValue *local_500;
  TValue *local_4f0;
  TValue *local_4e0;
  TValue *local_4d0;
  bool local_4b9;
  TValue *local_4b8;
  TValue *local_4b0;
  bool local_4a2;
  bool local_4a1;
  TValue *local_4a0;
  TValue *local_498;
  TValue *local_488;
  TValue *local_480;
  TValue *local_478;
  TValue *local_470;
  TValue *local_468;
  TValue *local_460;
  TValue *local_458;
  TValue *local_450;
  TValue *local_448;
  TValue *local_440;
  TValue *local_438;
  StkId local_410;
  TValue *local_400;
  TValue *local_3e8;
  TValue *o1_13;
  TValue *o2_13;
  int n_1;
  CallInfo *ci_1;
  int j_1;
  int b_6;
  TValue *i_o_17;
  int j;
  int nup;
  Closure *ncl;
  Proto *p;
  TValue *o1_12;
  TValue *o2_12;
  TValue *val;
  Table *h;
  uint local_358;
  int last;
  int c_2;
  int n;
  TValue *o1_11;
  TValue *o2_11;
  TValue *o1_10;
  TValue *o2_10;
  TValue *o1_9;
  TValue *o2_9;
  TValue *o1_8;
  TValue *o2_8;
  StkId cb;
  TValue *i_o_16;
  TValue *pstep;
  TValue *plimit;
  TValue *init;
  TValue *i_o_15;
  TValue *i_o_14;
  lua_Number limit;
  lua_Number idx;
  lua_Number step;
  int b_5;
  TValue *o1_7;
  TValue *o2_7;
  StkId pfunc;
  StkId func;
  int aux;
  CallInfo *ci;
  int b_4;
  int nresults;
  int b_3;
  TValue *o1_6;
  TValue *o2_6;
  TValue *rb_12;
  TValue *rc_6;
  TValue *rb_11;
  TValue *o1_5;
  TValue *o2_5;
  int c_1;
  int b_2;
  TValue *i_o_13;
  TValue *i_o_12;
  TValue *rb_10;
  TValue *i_o_11;
  int res;
  TValue *i_o_10;
  lua_Number nb_6;
  TValue *rb_9;
  TValue *i_o_9;
  lua_Number nc_5;
  lua_Number nb_5;
  TValue *rc_5;
  TValue *rb_8;
  TValue *i_o_8;
  lua_Number nc_4;
  lua_Number nb_4;
  TValue *rc_4;
  TValue *rb_7;
  TValue *i_o_7;
  lua_Number nc_3;
  lua_Number nb_3;
  TValue *rc_3;
  TValue *rb_6;
  TValue *i_o_6;
  lua_Number nc_2;
  lua_Number nb_2;
  TValue *rc_2;
  TValue *rb_5;
  TValue *i_o_5;
  lua_Number nc_1;
  lua_Number nb_1;
  TValue *rc_1;
  TValue *rb_4;
  TValue *i_o_4;
  lua_Number nc;
  lua_Number nb;
  TValue *rc;
  TValue *rb_3;
  TValue *o1_4;
  TValue *o2_4;
  StkId rb_2;
  TValue *i_o_3;
  int c;
  int b_1;
  TValue *o1_3;
  TValue *o2_3;
  UpVal *uv;
  TValue *i_o_2;
  TValue g_1;
  TValue *i_o_1;
  TValue *rb_1;
  TValue g;
  TValue *o1_2;
  TValue *o2_2;
  TValue *pTStack_78;
  int b;
  TValue *rb;
  TValue *i_o;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  StkId ra;
  Instruction *pIStack_38;
  Instruction i;
  Instruction *pc;
  TValue *k;
  StkId base;
  LClosure *cl;
  int nexeccalls_local;
  lua_State *L_local;
  
  cl._4_4_ = nexeccalls;
LAB_001212f2:
  do {
    pGVar3 = (L->ci->func->value).gc;
    k = L->base;
    p_Var4 = ((pGVar3->th).l_G)->frealloc;
    pc_00 = L->savedpc;
switchD_001213f2_default:
    pIStack_38 = pc_00;
    pc_00 = pIStack_38 + 1;
    uVar17 = *pIStack_38;
    if (((L->hookmask & 0xc) != 0) &&
       ((iVar8 = L->hookcount + -1, L->hookcount = iVar8, iVar8 == 0 || ((L->hookmask & 4) != 0))))
    {
      traceexec(L,pc_00);
      if (L->status == '\x01') {
        L->savedpc = pIStack_38;
        return;
      }
      k = L->base;
    }
    o2 = (TValue *)((long)&k->value + (ulong)(uVar17 >> 2 & 0xff0));
    switch(uVar17 & 0x3f) {
    case 0:
      o2->value = k[(int)(uVar17 >> 0x17)].value;
      o2->tt = k[(int)(uVar17 >> 0x17)].tt;
      goto switchD_001213f2_default;
    case 1:
      o2->value = *(Value *)(p_Var4 + (long)(int)(uVar17 >> 0xe) * 0x10);
      o2->tt = ((Value *)(p_Var4 + (long)(int)(uVar17 >> 0xe) * 0x10))[1].b;
      goto switchD_001213f2_default;
    case 2:
      (o2->value).b = uVar17 >> 0x17;
      o2->tt = 1;
      if ((uVar17 >> 0xe & 0x1ff) != 0) {
        pc_00 = pIStack_38 + 2;
      }
      goto switchD_001213f2_default;
    case 3:
      pTStack_78 = k + (int)(uVar17 >> 0x17);
      do {
        pTVar13 = pTStack_78 + -1;
        pTStack_78->tt = 0;
        pTStack_78 = pTVar13;
      } while (o2 <= pTVar13);
      goto switchD_001213f2_default;
    case 4:
      pVVar5 = *(Value **)(*(long *)((long)pGVar3 + (long)(int)(uVar17 >> 0x17) * 8 + 0x28) + 0x10);
      o2->value = *pVVar5;
      o2->tt = pVVar5[1].b;
      g._8_8_ = o2;
      goto switchD_001213f2_default;
    case 5:
      g_1._8_8_ = &rb_1;
      rb_1 = (pGVar3->h).array;
      g.value.b = 5;
      L->savedpc = pc_00;
      luaV_gettable(L,(TValue *)&rb_1,(TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe) * 0x10),o2);
      k = L->base;
      goto switchD_001213f2_default;
    case 6:
      L->savedpc = pc_00;
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_3e8 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_3e8 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      luaV_gettable(L,k + (int)(uVar17 >> 0x17),local_3e8,o2);
      k = L->base;
      goto switchD_001213f2_default;
    case 7:
      i_o_2 = (pGVar3->h).array;
      g_1.value.b = 5;
      L->savedpc = pc_00;
      luaV_settable(L,(TValue *)&i_o_2,(TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe) * 0x10),o2);
      k = L->base;
      goto switchD_001213f2_default;
    case 8:
      pGVar11 = *(GCObject **)((long)pGVar3 + (long)(int)(uVar17 >> 0x17) * 8 + 0x28);
      pTVar13 = (pGVar11->p).k;
      pTVar13->value = o2->value;
      pTVar13->tt = o2->tt;
      if (((3 < o2->tt) && (((((o2->value).gc)->gch).marked & 3) != 0)) &&
         (((pGVar11->gch).marked & 4) != 0)) {
        luaC_barrierf(L,pGVar11,(o2->value).gc);
      }
      goto switchD_001213f2_default;
    case 9:
      L->savedpc = pc_00;
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_400 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_400 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_410 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_410 = (StkId)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      luaV_settable(L,o2,local_400,local_410);
      k = L->base;
      goto switchD_001213f2_default;
    case 10:
      iVar8 = luaO_fb2int(uVar17 >> 0x17);
      iVar10 = luaO_fb2int(uVar17 >> 0xe & 0x1ff);
      pGVar11 = (GCObject *)luaH_new(L,iVar8,iVar10);
      (o2->value).gc = pGVar11;
      o2->tt = 5;
      L->savedpc = pc_00;
      if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
        luaC_step(L);
      }
      k = L->base;
      goto switchD_001213f2_default;
    case 0xb:
      pTVar13 = k + (int)(uVar17 >> 0x17);
      o2[1].value = pTVar13->value;
      o2[1].tt = pTVar13->tt;
      L->savedpc = pc_00;
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_438 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_438 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      luaV_gettable(L,pTVar13,local_438,o2);
      k = L->base;
      goto switchD_001213f2_default;
    case 0xc:
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_440 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_440 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_448 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_448 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      if ((local_440->tt == 3) && (local_448->tt == 3)) {
        (o2->value).n = (local_440->value).n + (local_448->value).n;
        o2->tt = 3;
      }
      else {
        L->savedpc = pc_00;
        Arith(L,o2,local_440,local_448,TM_ADD);
        k = L->base;
      }
      goto switchD_001213f2_default;
    case 0xd:
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_450 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_450 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_458 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_458 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      if ((local_450->tt == 3) && (local_458->tt == 3)) {
        (o2->value).n = (local_450->value).n - (local_458->value).n;
        o2->tt = 3;
      }
      else {
        L->savedpc = pc_00;
        Arith(L,o2,local_450,local_458,TM_SUB);
        k = L->base;
      }
      goto switchD_001213f2_default;
    case 0xe:
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_460 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_460 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_468 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_468 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      if ((local_460->tt == 3) && (local_468->tt == 3)) {
        (o2->value).n = (local_460->value).n * (local_468->value).n;
        o2->tt = 3;
      }
      else {
        L->savedpc = pc_00;
        Arith(L,o2,local_460,local_468,TM_MUL);
        k = L->base;
      }
      goto switchD_001213f2_default;
    case 0xf:
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_470 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_470 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_478 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_478 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      if ((local_470->tt == 3) && (local_478->tt == 3)) {
        (o2->value).n = (local_470->value).n / (local_478->value).n;
        o2->tt = 3;
      }
      else {
        L->savedpc = pc_00;
        Arith(L,o2,local_470,local_478,TM_DIV);
        k = L->base;
      }
      goto switchD_001213f2_default;
    case 0x10:
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_480 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_480 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_488 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_488 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      if ((local_480->tt == 3) && (local_488->tt == 3)) {
        dVar20 = (local_480->value).n;
        dVar1 = (local_488->value).n;
        dVar19 = floor(dVar20 / dVar1);
        (o2->value).n = -dVar19 * dVar1 + dVar20;
        o2->tt = 3;
      }
      else {
        L->savedpc = pc_00;
        Arith(L,o2,local_480,local_488,TM_MOD);
        k = L->base;
      }
      goto switchD_001213f2_default;
    case 0x11:
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_498 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_498 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_4a0 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_4a0 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      if ((local_498->tt == 3) && (local_4a0->tt == 3)) {
        dVar20 = pow((local_498->value).n,(local_4a0->value).n);
        (o2->value).n = dVar20;
        o2->tt = 3;
      }
      else {
        L->savedpc = pc_00;
        Arith(L,o2,local_498,local_4a0,TM_POW);
        k = L->base;
      }
      goto switchD_001213f2_default;
    case 0x12:
      pTVar13 = k + (int)(uVar17 >> 0x17);
      if (pTVar13->tt == 3) {
        (o2->value).gc = (GCObject *)((ulong)(pTVar13->value).gc ^ 0x8000000000000000);
        o2->tt = 3;
      }
      else {
        L->savedpc = pc_00;
        Arith(L,o2,pTVar13,pTVar13,TM_UNM);
        k = L->base;
      }
      goto switchD_001213f2_default;
    case 0x13:
      local_4a1 = true;
      if (k[(int)(uVar17 >> 0x17)].tt != 0) {
        local_4a2 = false;
        if (k[(int)(uVar17 >> 0x17)].tt == 1) {
          local_4a2 = k[(int)(uVar17 >> 0x17)].value.b == 0;
        }
        local_4a1 = local_4a2;
      }
      *(uint *)&o2->value = (uint)local_4a1;
      o2->tt = 1;
      goto switchD_001213f2_default;
    case 0x14:
      pTVar13 = (TValue *)((long)&k->value + (ulong)(uVar17 >> 0x13 & 0xfffffff0));
      if (pTVar13->tt == 4) {
        uVar2 = *(undefined8 *)((long)(pTVar13->value).gc + 0x10);
        auVar21._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar21._0_8_ = uVar2;
        auVar21._12_4_ = 0x45300000;
        (o2->value).n =
             (auVar21._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        o2->tt = 3;
      }
      else if (pTVar13->tt == 5) {
        iVar8 = luaH_getn(&((pTVar13->value).gc)->h);
        (o2->value).n = (double)iVar8;
        o2->tt = 3;
      }
      else {
        L->savedpc = pc_00;
        iVar8 = call_binTM(L,pTVar13,&luaO_nilobject_,o2,TM_LEN);
        if (iVar8 == 0) {
          luaG_typeerror(L,pTVar13,"get length of");
        }
        k = L->base;
      }
      goto switchD_001213f2_default;
    case 0x15:
      uVar9 = uVar17 >> 0xe & 0x1ff;
      L->savedpc = pc_00;
      luaV_concat(L,(uVar9 - (uVar17 >> 0x17)) + 1,uVar9);
      if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
        luaC_step(L);
      }
      k = L->base;
      k[(int)(uVar17 >> 6 & 0xff)].value = k[(int)(uVar17 >> 0x17)].value;
      k[(int)(uVar17 >> 6 & 0xff)].tt = k[(int)(uVar17 >> 0x17)].tt;
      goto switchD_001213f2_default;
    case 0x16:
      pc_00 = pc_00 + (int)((uVar17 >> 0xe) - 0x1ffff);
      goto switchD_001213f2_default;
    case 0x17:
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_4b0 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_4b0 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_4b8 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_4b8 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      L->savedpc = pc_00;
      local_4b9 = false;
      if (local_4b0->tt == local_4b8->tt) {
        iVar8 = luaV_equalval(L,local_4b0,local_4b8);
        local_4b9 = iVar8 != 0;
      }
      pIStack_38 = pc_00;
      if ((uint)local_4b9 == (uVar17 >> 6 & 0xff)) {
        pIStack_38 = pc_00 + (int)((*pc_00 >> 0xe) - 0x1ffff);
      }
      k = L->base;
      pc_00 = pIStack_38 + 1;
      goto switchD_001213f2_default;
    case 0x18:
      L->savedpc = pc_00;
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_4d0 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_4d0 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_4e0 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_4e0 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      uVar9 = luaV_lessthan(L,local_4d0,local_4e0);
      pIStack_38 = pc_00;
      if (uVar9 == (uVar17 >> 6 & 0xff)) {
        pIStack_38 = pc_00 + (int)((*pc_00 >> 0xe) - 0x1ffff);
      }
      k = L->base;
      pc_00 = pIStack_38 + 1;
      goto switchD_001213f2_default;
    case 0x19:
      L->savedpc = pc_00;
      if ((uVar17 >> 0x17 & 0x100) == 0) {
        local_4f0 = k + (int)(uVar17 >> 0x17);
      }
      else {
        local_4f0 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0x17 & 0xff) * 0x10);
      }
      if ((uVar17 >> 0xe & 0x100) == 0) {
        local_500 = k + (int)(uVar17 >> 0xe & 0x1ff);
      }
      else {
        local_500 = (TValue *)(p_Var4 + (long)(int)(uVar17 >> 0xe & 0xff) * 0x10);
      }
      uVar9 = lessequal(L,local_4f0,local_500);
      pIStack_38 = pc_00;
      if (uVar9 == (uVar17 >> 6 & 0xff)) {
        pIStack_38 = pc_00 + (int)((*pc_00 >> 0xe) - 0x1ffff);
      }
      k = L->base;
      pc_00 = pIStack_38 + 1;
      goto switchD_001213f2_default;
    case 0x1a:
      local_501 = true;
      if (o2->tt != 0) {
        local_502 = false;
        if (o2->tt == 1) {
          local_502 = (o2->value).b == 0;
        }
        local_501 = local_502;
      }
      pIStack_38 = pc_00;
      if ((uint)local_501 != (uVar17 >> 0xe & 0x1ff)) {
        pIStack_38 = pc_00 + (int)((*pc_00 >> 0xe) - 0x1ffff);
      }
      pc_00 = pIStack_38 + 1;
      goto switchD_001213f2_default;
    case 0x1b:
      pTVar13 = k + (int)(uVar17 >> 0x17);
      local_503 = true;
      if (pTVar13->tt != 0) {
        local_504 = false;
        if (pTVar13->tt == 1) {
          local_504 = (pTVar13->value).b == 0;
        }
        local_503 = local_504;
      }
      pIStack_38 = pc_00;
      if ((uint)local_503 != (uVar17 >> 0xe & 0x1ff)) {
        o2->value = pTVar13->value;
        o2->tt = pTVar13->tt;
        pIStack_38 = pc_00 + (int)((*pc_00 >> 0xe) - 0x1ffff);
      }
      pc_00 = pIStack_38 + 1;
      goto switchD_001213f2_default;
    case 0x1c:
      iVar8 = (uVar17 >> 0xe & 0x1ff) - 1;
      if (uVar17 >> 0x17 != 0) {
        L->top = o2 + (int)(uVar17 >> 0x17);
      }
      L->savedpc = pc_00;
      iVar10 = luaD_precall(L,o2,iVar8);
      if (iVar10 == 0) {
        cl._4_4_ = cl._4_4_ + 1;
        break;
      }
      if (iVar10 != 1) {
        return;
      }
      if (-1 < iVar8) {
        L->top = L->ci->top;
      }
      k = L->base;
      goto switchD_001213f2_default;
    case 0x1d:
      if (uVar17 >> 0x17 != 0) {
        L->top = o2 + (int)(uVar17 >> 0x17);
      }
      L->savedpc = pc_00;
      iVar8 = luaD_precall(L,o2,-1);
      if (iVar8 != 0) {
        if (iVar8 != 1) {
          return;
        }
        k = L->base;
        goto switchD_001213f2_default;
      }
      pCVar7 = L->ci;
      pTVar18 = pCVar7[-1].func;
      pTVar6 = pCVar7->func;
      if (L->openupval != (GCObject *)0x0) {
        luaF_close(L,pCVar7[-1].base);
      }
      pCVar7[-1].base = pCVar7[-1].func + ((long)pCVar7->base - (long)pTVar6 >> 4);
      L->base = pCVar7[-1].func + ((long)pCVar7->base - (long)pTVar6 >> 4);
      for (func._4_4_ = 0; pTVar6 + func._4_4_ < L->top; func._4_4_ = func._4_4_ + 1) {
        pTVar12 = pTVar18 + func._4_4_;
        pTVar12->value = pTVar6[func._4_4_].value;
        pTVar12->tt = pTVar6[func._4_4_].tt;
      }
      pTVar18 = pTVar18 + func._4_4_;
      L->top = pTVar18;
      pCVar7[-1].top = pTVar18;
      pCVar7[-1].savedpc = L->savedpc;
      pCVar7[-1].tailcalls = pCVar7[-1].tailcalls + 1;
      L->ci = L->ci + -1;
      break;
    case 0x1e:
      goto switchD_001213f2_caseD_1e;
    case 0x1f:
      dVar20 = (o2->value).n + o2[2].value.n;
      if (o2[2].value.n <= 0.0) {
        if (dVar20 < o2[1].value.n) goto switchD_001213f2_default;
      }
      else if (o2[1].value.n < dVar20) goto switchD_001213f2_default;
      (o2->value).n = dVar20;
      o2->tt = 3;
      o2[3].value.n = dVar20;
      o2[3].tt = 3;
      pc_00 = pc_00 + (int)((uVar17 >> 0xe) - 0x1ffff);
      goto switchD_001213f2_default;
    case 0x20:
      i_o_16 = o2 + 2;
      L->savedpc = pc_00;
      if ((o2->tt == 3) || (pTVar13 = luaV_tonumber(o2,o2), pTVar13 != (TValue *)0x0)) {
        if ((o2[1].tt == 3) || (pTVar13 = luaV_tonumber(o2 + 1,o2 + 1), pTVar13 != (TValue *)0x0)) {
          if ((o2[2].tt != 3) && (i_o_16 = luaV_tonumber(i_o_16,o2 + 2), i_o_16 == (TValue *)0x0)) {
            luaG_runerror(L,"\'for\' step must be a number");
          }
        }
        else {
          luaG_runerror(L,"\'for\' limit must be a number");
        }
      }
      else {
        luaG_runerror(L,"\'for\' initial value must be a number");
      }
      (o2->value).n = (o2->value).n - (i_o_16->value).n;
      o2->tt = 3;
      pc_00 = pc_00 + (int)((uVar17 >> 0xe) - 0x1ffff);
      goto switchD_001213f2_default;
    case 0x21:
      o2[5].value = o2[2].value;
      o2[5].tt = o2[2].tt;
      o2[4].value = o2[1].value;
      o2[4].tt = o2[1].tt;
      o2[3].value = o2->value;
      o2[3].tt = o2->tt;
      L->top = o2 + 6;
      L->savedpc = pc_00;
      luaD_call(L,o2 + 3,uVar17 >> 0xe & 0x1ff);
      k = L->base;
      L->top = L->ci->top;
      uVar17 = uVar17 >> 6 & 0xff;
      pIStack_38 = pc_00;
      if (k[(long)(int)uVar17 + 3].tt != 0) {
        k[(long)(int)uVar17 + 2].value = k[(long)(int)uVar17 + 3].value;
        k[(long)(int)uVar17 + 2].tt = k[(long)(int)uVar17 + 3].tt;
        pIStack_38 = pc_00 + (int)((*pc_00 >> 0xe) - 0x1ffff);
      }
      pc_00 = pIStack_38 + 1;
      goto switchD_001213f2_default;
    case 0x22:
      last = uVar17 >> 0x17;
      local_358 = uVar17 >> 0xe & 0x1ff;
      if (last == 0) {
        last = (int)((long)L->top - (long)o2 >> 4) + -1;
        L->top = L->ci->top;
      }
      if (local_358 == 0) {
        local_358 = *pc_00;
        pc_00 = pIStack_38 + 2;
      }
      pIStack_38 = pc_00;
      pc_00 = pIStack_38;
      if (o2->tt == 5) {
        pGVar11 = (o2->value).gc;
        h._4_4_ = (local_358 - 1) * 0x32 + last;
        if ((pGVar11->h).sizearray < h._4_4_) {
          luaH_resizearray(L,&pGVar11->h,h._4_4_);
        }
        for (; 0 < last; last = last + -1) {
          pTVar13 = o2 + last;
          pTVar14 = luaH_setnum(L,&pGVar11->h,h._4_4_);
          pTVar14->value = pTVar13->value;
          pTVar14->tt = pTVar13->tt;
          if (((3 < pTVar13->tt) && (((((pTVar13->value).gc)->gch).marked & 3) != 0)) &&
             (((pGVar11->gch).marked & 4) != 0)) {
            luaC_barrierback(L,&pGVar11->h);
          }
          h._4_4_ = h._4_4_ + -1;
        }
      }
      goto switchD_001213f2_default;
    case 0x23:
      luaF_close(L,o2);
      goto switchD_001213f2_default;
    case 0x24:
      pGVar11 = (&(((((pGVar3->h).node)->i_key).nk.next)->i_val).value)[(int)(uVar17 >> 0xe)].gc;
      uVar17 = (uint)(byte)*(lu_mem *)&(pGVar11->p).nups;
      pGVar15 = (GCObject *)luaF_newLclosure(L,uVar17,(Table *)(pGVar3->h).array);
      (pGVar15->th).l_G = (global_State *)pGVar11;
      pIStack_38 = pc_00;
      for (i_o_17._0_4_ = 0; (int)i_o_17 < (int)uVar17; i_o_17._0_4_ = (int)i_o_17 + 1) {
        if ((*pIStack_38 & 0x3f) == 4) {
          *(undefined8 *)((long)pGVar15 + (long)(int)i_o_17 * 8 + 0x28) =
               *(undefined8 *)((long)pGVar3 + (long)(int)(*pIStack_38 >> 0x17) * 8 + 0x28);
        }
        else {
          pUVar16 = luaF_findupval(L,k + (int)(*pIStack_38 >> 0x17));
          *(UpVal **)((long)pGVar15 + (long)(int)i_o_17 * 8 + 0x28) = pUVar16;
        }
        pIStack_38 = pIStack_38 + 1;
      }
      (o2->value).gc = pGVar15;
      o2->tt = 6;
      L->savedpc = pIStack_38;
      if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
        luaC_step(L);
      }
      k = L->base;
      pc_00 = pIStack_38;
      goto switchD_001213f2_default;
    case 0x25:
      ci_1._4_4_ = (uVar17 >> 0x17) - 1;
      pCVar7 = L->ci;
      iVar8 = ((int)((long)pCVar7->base - (long)pCVar7->func >> 4) -
              (uint)*(byte *)((long)&((pGVar3->th).l_G)->GCthreshold + 1)) + -1;
      if (ci_1._4_4_ == -1) {
        L->savedpc = pc_00;
        if ((long)L->stack_last - (long)L->top <= (long)(iVar8 * 0x10)) {
          luaD_growstack(L,iVar8);
        }
        k = L->base;
        o2 = k + (int)(uVar17 >> 6 & 0xff);
        L->top = o2 + iVar8;
        ci_1._4_4_ = iVar8;
      }
      for (ci_1._0_4_ = 0; (int)ci_1 < ci_1._4_4_; ci_1._0_4_ = (int)ci_1 + 1) {
        if ((int)ci_1 < iVar8) {
          pTVar18 = pCVar7->base;
          o2[(int)ci_1].value = pTVar18[(long)(int)ci_1 - (long)iVar8].value;
          o2[(int)ci_1].tt = (&pTVar18[(long)(int)ci_1 - (long)iVar8].value)[1].b;
        }
        else {
          o2[(int)ci_1].tt = 0;
        }
      }
    default:
      goto switchD_001213f2_default;
    }
  } while( true );
switchD_001213f2_caseD_1e:
  if (uVar17 >> 0x17 != 0) {
    L->top = o2 + (long)(int)(uVar17 >> 0x17) + -1;
  }
  if (L->openupval != (GCObject *)0x0) {
    luaF_close(L,k);
  }
  L->savedpc = pc_00;
  iVar8 = luaD_poscall(L,o2);
  cl._4_4_ = cl._4_4_ + -1;
  if (cl._4_4_ == 0) {
    return;
  }
  if (iVar8 != 0) {
    L->top = L->ci->top;
  }
  goto LAB_001212f2;
}

Assistant:

void luaV_execute (lua_State *L, int nexeccalls) {
  LClosure *cl;
  StkId base;
  TValue *k;
  const Instruction *pc;
 reentry:  /* entry point */
  lua_assert(isLua(L->ci));
  pc = L->savedpc;
  cl = &clvalue(L->ci->func)->l;
  base = L->base;
  k = cl->p->k;
  /* main loop of interpreter */
  for (;;) {
    const Instruction i = *pc++;
    StkId ra;
    if ((L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) &&
        (--L->hookcount == 0 || L->hookmask & LUA_MASKLINE)) {
      traceexec(L, pc);
      if (L->status == LUA_YIELD) {  /* did hook yield? */
        L->savedpc = pc - 1;
        return;
      }
      base = L->base;
    }
    /* warning!! several calls may realloc the stack and invalidate `ra' */
    ra = RA(i);
    lua_assert(base == L->base && L->base == L->ci->base);
    lua_assert(base <= L->top && L->top <= L->stack + L->stacksize);
    lua_assert(L->top == L->ci->top || luaG_checkopenop(i));
    switch (GET_OPCODE(i)) {
      case OP_MOVE: {
        setobjs2s(L, ra, RB(i));
        continue;
      }
      case OP_LOADK: {
        setobj2s(L, ra, KBx(i));
        continue;
      }
      case OP_LOADBOOL: {
        setbvalue(ra, GETARG_B(i));
        if (GETARG_C(i)) pc++;  /* skip next instruction (if C) */
        continue;
      }
      case OP_LOADNIL: {
        TValue *rb = RB(i);
        do {
          setnilvalue(rb--);
        } while (rb >= ra);
        continue;
      }
      case OP_GETUPVAL: {
        int b = GETARG_B(i);
        setobj2s(L, ra, cl->upvals[b]->v);
        continue;
      }
      case OP_GETGLOBAL: {
        TValue g;
        TValue *rb = KBx(i);
        sethvalue(L, &g, cl->env);
        lua_assert(ttisstring(rb));
        Protect(luaV_gettable(L, &g, rb, ra));
        continue;
      }
      case OP_GETTABLE: {
        Protect(luaV_gettable(L, RB(i), RKC(i), ra));
        continue;
      }
      case OP_SETGLOBAL: {
        TValue g;
        sethvalue(L, &g, cl->env);
        lua_assert(ttisstring(KBx(i)));
        Protect(luaV_settable(L, &g, KBx(i), ra));
        continue;
      }
      case OP_SETUPVAL: {
        UpVal *uv = cl->upvals[GETARG_B(i)];
        setobj(L, uv->v, ra);
        luaC_barrier(L, uv, ra);
        continue;
      }
      case OP_SETTABLE: {
        Protect(luaV_settable(L, ra, RKB(i), RKC(i)));
        continue;
      }
      case OP_NEWTABLE: {
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        sethvalue(L, ra, luaH_new(L, luaO_fb2int(b), luaO_fb2int(c)));
        Protect(luaC_checkGC(L));
        continue;
      }
      case OP_SELF: {
        StkId rb = RB(i);
        setobjs2s(L, ra+1, rb);
        Protect(luaV_gettable(L, rb, RKC(i), ra));
        continue;
      }
      case OP_ADD: {
        arith_op(luai_numadd, TM_ADD);
        continue;
      }
      case OP_SUB: {
        arith_op(luai_numsub, TM_SUB);
        continue;
      }
      case OP_MUL: {
        arith_op(luai_nummul, TM_MUL);
        continue;
      }
      case OP_DIV: {
        arith_op(luai_numdiv, TM_DIV);
        continue;
      }
      case OP_MOD: {
        arith_op(luai_nummod, TM_MOD);
        continue;
      }
      case OP_POW: {
        arith_op(luai_numpow, TM_POW);
        continue;
      }
      case OP_UNM: {
        TValue *rb = RB(i);
        if (ttisnumber(rb)) {
          lua_Number nb = nvalue(rb);
          setnvalue(ra, luai_numunm(nb));
        }
        else {
          Protect(Arith(L, ra, rb, rb, TM_UNM));
        }
        continue;
      }
      case OP_NOT: {
        int res = l_isfalse(RB(i));  /* next assignment may change this value */
        setbvalue(ra, res);
        continue;
      }
      case OP_LEN: {
        const TValue *rb = RB(i);
        switch (ttype(rb)) {
          case LUA_TTABLE: {
            setnvalue(ra, cast_num(luaH_getn(hvalue(rb))));
            break;
          }
          case LUA_TSTRING: {
            setnvalue(ra, cast_num(tsvalue(rb)->len));
            break;
          }
          default: {  /* try metamethod */
            Protect(
              if (!call_binTM(L, rb, luaO_nilobject, ra, TM_LEN))
                luaG_typeerror(L, rb, "get length of");
            )
          }
        }
        continue;
      }
      case OP_CONCAT: {
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        Protect(luaV_concat(L, c-b+1, c); luaC_checkGC(L));
        setobjs2s(L, RA(i), base+b);
        continue;
      }
      case OP_JMP: {
        dojump(L, pc, GETARG_sBx(i));
        continue;
      }
      case OP_EQ: {
        TValue *rb = RKB(i);
        TValue *rc = RKC(i);
        Protect(
          if (equalobj(L, rb, rc) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_LT: {
        Protect(
          if (luaV_lessthan(L, RKB(i), RKC(i)) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_LE: {
        Protect(
          if (lessequal(L, RKB(i), RKC(i)) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_TEST: {
        if (l_isfalse(ra) != GETARG_C(i))
          dojump(L, pc, GETARG_sBx(*pc));
        pc++;
        continue;
      }
      case OP_TESTSET: {
        TValue *rb = RB(i);
        if (l_isfalse(rb) != GETARG_C(i)) {
          setobjs2s(L, ra, rb);
          dojump(L, pc, GETARG_sBx(*pc));
        }
        pc++;
        continue;
      }
      case OP_CALL: {
        int b = GETARG_B(i);
        int nresults = GETARG_C(i) - 1;
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        L->savedpc = pc;
        switch (luaD_precall(L, ra, nresults)) {
          case PCRLUA: {
            nexeccalls++;
            goto reentry;  /* restart luaV_execute over new Lua function */
          }
          case PCRC: {
            /* it was a C function (`precall' called it); adjust results */
            if (nresults >= 0) L->top = L->ci->top;
            base = L->base;
            continue;
          }
          default: {
            return;  /* yield */
          }
        }
      }
      case OP_TAILCALL: {
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        L->savedpc = pc;
        lua_assert(GETARG_C(i) - 1 == LUA_MULTRET);
        switch (luaD_precall(L, ra, LUA_MULTRET)) {
          case PCRLUA: {
            /* tail call: put new frame in place of previous one */
            CallInfo *ci = L->ci - 1;  /* previous frame */
            int aux;
            StkId func = ci->func;
            StkId pfunc = (ci+1)->func;  /* previous function index */
            if (L->openupval) luaF_close(L, ci->base);
            L->base = ci->base = ci->func + ((ci+1)->base - pfunc);
            for (aux = 0; pfunc+aux < L->top; aux++)  /* move frame down */
              setobjs2s(L, func+aux, pfunc+aux);
            ci->top = L->top = func+aux;  /* correct top */
            lua_assert(L->top == L->base + clvalue(func)->l.p->maxstacksize);
            ci->savedpc = L->savedpc;
            ci->tailcalls++;  /* one more call lost */
            L->ci--;  /* remove new frame */
            goto reentry;
          }
          case PCRC: {  /* it was a C function (`precall' called it) */
            base = L->base;
            continue;
          }
          default: {
            return;  /* yield */
          }
        }
      }
      case OP_RETURN: {
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b-1;
        if (L->openupval) luaF_close(L, base);
        L->savedpc = pc;
        b = luaD_poscall(L, ra);
        if (--nexeccalls == 0)  /* was previous function running `here'? */
          return;  /* no: return */
        else {  /* yes: continue its execution */
          if (b) L->top = L->ci->top;
          lua_assert(isLua(L->ci));
          lua_assert(GET_OPCODE(*((L->ci)->savedpc - 1)) == OP_CALL);
          goto reentry;
        }
      }
      case OP_FORLOOP: {
        lua_Number step = nvalue(ra+2);
        lua_Number idx = luai_numadd(nvalue(ra), step); /* increment index */
        lua_Number limit = nvalue(ra+1);
        if (luai_numlt(0, step) ? luai_numle(idx, limit)
                                : luai_numle(limit, idx)) {
          dojump(L, pc, GETARG_sBx(i));  /* jump back */
          setnvalue(ra, idx);  /* update internal index... */
          setnvalue(ra+3, idx);  /* ...and external index */
        }
        continue;
      }
      case OP_FORPREP: {
        const TValue *init = ra;
        const TValue *plimit = ra+1;
        const TValue *pstep = ra+2;
        L->savedpc = pc;  /* next steps may throw errors */
        if (!tonumber(init, ra))
          luaG_runerror(L, LUA_QL("for") " initial value must be a number");
        else if (!tonumber(plimit, ra+1))
          luaG_runerror(L, LUA_QL("for") " limit must be a number");
        else if (!tonumber(pstep, ra+2))
          luaG_runerror(L, LUA_QL("for") " step must be a number");
        setnvalue(ra, luai_numsub(nvalue(ra), nvalue(pstep)));
        dojump(L, pc, GETARG_sBx(i));
        continue;
      }
      case OP_TFORLOOP: {
        StkId cb = ra + 3;  /* call base */
        setobjs2s(L, cb+2, ra+2);
        setobjs2s(L, cb+1, ra+1);
        setobjs2s(L, cb, ra);
        L->top = cb+3;  /* func. + 2 args (state and index) */
        Protect(luaD_call(L, cb, GETARG_C(i)));
        L->top = L->ci->top;
        cb = RA(i) + 3;  /* previous call may change the stack */
        if (!ttisnil(cb)) {  /* continue loop? */
          setobjs2s(L, cb-1, cb);  /* save control variable */
          dojump(L, pc, GETARG_sBx(*pc));  /* jump back */
        }
        pc++;
        continue;
      }
      case OP_SETLIST: {
        int n = GETARG_B(i);
        int c = GETARG_C(i);
        int last;
        Table *h;
        if (n == 0) {
          n = cast_int(L->top - ra) - 1;
          L->top = L->ci->top;
        }
        if (c == 0) c = cast_int(*pc++);
        runtime_check(L, ttistable(ra));
        h = hvalue(ra);
        last = ((c-1)*LFIELDS_PER_FLUSH) + n;
        if (last > h->sizearray)  /* needs more space? */
          luaH_resizearray(L, h, last);  /* pre-alloc it at once */
        for (; n > 0; n--) {
          TValue *val = ra+n;
          setobj2t(L, luaH_setnum(L, h, last--), val);
          luaC_barriert(L, h, val);
        }
        continue;
      }
      case OP_CLOSE: {
        luaF_close(L, ra);
        continue;
      }
      case OP_CLOSURE: {
        Proto *p;
        Closure *ncl;
        int nup, j;
        p = cl->p->p[GETARG_Bx(i)];
        nup = p->nups;
        ncl = luaF_newLclosure(L, nup, cl->env);
        ncl->l.p = p;
        for (j=0; j<nup; j++, pc++) {
          if (GET_OPCODE(*pc) == OP_GETUPVAL)
            ncl->l.upvals[j] = cl->upvals[GETARG_B(*pc)];
          else {
            lua_assert(GET_OPCODE(*pc) == OP_MOVE);
            ncl->l.upvals[j] = luaF_findupval(L, base + GETARG_B(*pc));
          }
        }
        setclvalue(L, ra, ncl);
        Protect(luaC_checkGC(L));
        continue;
      }
      case OP_VARARG: {
        int b = GETARG_B(i) - 1;
        int j;
        CallInfo *ci = L->ci;
        int n = cast_int(ci->base - ci->func) - cl->p->numparams - 1;
        if (b == LUA_MULTRET) {
          Protect(luaD_checkstack(L, n));
          ra = RA(i);  /* previous call may change the stack */
          b = n;
          L->top = ra + n;
        }
        for (j = 0; j < b; j++) {
          if (j < n) {
            setobjs2s(L, ra + j, ci->base - n + j);
          }
          else {
            setnilvalue(ra + j);
          }
        }
        continue;
      }
    }
  }
}